

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O1

Instruction * spvtools::opt::anon_unknown_0::GetVariableType(IRContext *context,Instruction *var)

{
  uint32_t uVar1;
  Instruction *pIVar2;
  uint uVar3;
  
  if (var->opcode_ == OpVariable) {
    uVar1 = 0;
    if (var->has_type_id_ == true) {
      uVar1 = Instruction::GetSingleWordOperand(var,0);
    }
    if ((context->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(context);
    }
    pIVar2 = analysis::DefUseManager::GetDef
                       ((context->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar1);
    if (pIVar2->opcode_ == OpTypePointer) {
      uVar3 = (pIVar2->has_result_id_ & 1) + 1;
      if (pIVar2->has_type_id_ == false) {
        uVar3 = (uint)pIVar2->has_result_id_;
      }
      uVar1 = Instruction::GetSingleWordOperand(pIVar2,uVar3 + 1);
      if ((context->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(context);
      }
      pIVar2 = analysis::DefUseManager::GetDef
                         ((context->def_use_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                          _M_head_impl,uVar1);
      return pIVar2;
    }
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* GetVariableType(IRContext* context, Instruction* var) {
  if (var->opcode() != spv::Op::OpVariable) {
    return nullptr;
  }

  uint32_t ptr_type_id = var->type_id();
  Instruction* ptr_type_inst = context->get_def_use_mgr()->GetDef(ptr_type_id);
  if (ptr_type_inst->opcode() != spv::Op::OpTypePointer) {
    return nullptr;
  }

  uint32_t var_type_id = ptr_type_inst->GetSingleWordInOperand(1);
  return context->get_def_use_mgr()->GetDef(var_type_id);
}